

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int sint1i_(int *n,double *wsave,int *lensav,int *ier)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  int np1;
  double local_50;
  double *local_48;
  int *local_40;
  int lnsv;
  int ier1;
  
  *ier = 0;
  iVar1 = *lensav;
  iVar2 = *n;
  iVar5 = 2;
  dVar6 = log((double)iVar2);
  if ((int)(dVar6 / 0.6931471805599453) + iVar2 / 2 + iVar2 + 4 <= iVar1) {
    uVar3 = *n;
    if ((int)uVar3 < 2) {
      return 0;
    }
    local_48 = wsave + -1;
    np1 = uVar3 + 1;
    local_50 = (double)np1;
    dVar6 = 3.141592653589793 / local_50;
    uVar4 = 0;
    local_40 = ier;
    while (uVar3 >> 1 != uVar4) {
      dVar7 = sin((double)(int)(uVar4 + 1) * dVar6);
      wsave[uVar4] = dVar7 + dVar7;
      uVar4 = uVar4 + 1;
    }
    dVar6 = log(local_50);
    lnsv = (int)(dVar6 / 0.6931471805599453) + uVar3 + 5;
    rfft1i_(&np1,local_48 + (ulong)(uVar3 >> 1) + 1,&lnsv,&ier1);
    if (ier1 == 0) {
      return 0;
    }
    iVar5 = 0x14;
    ier = local_40;
  }
  *ier = iVar5;
  return 0;
}

Assistant:

int sint1i_(int *n, fft_real_t *wsave, int *lensav,
	int *ier)
{
    /* System generated locals */
    int i__1;

    /* Builtin functions */

    /* Local variables */
     int k;
     fft_real_t dt, pi;
     int np1, ns2, ier1, lnsv;
    extern /* Subroutine */ int rfft1i_(int *, fft_real_t *, int *, int
	    *), xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --wsave;

    /* Function Body */
    *ier = 0;

    if (*lensav < *n / 2 + *n + (int) (log((fft_real_t) (*n)) / log(2.0)) + 4) {
	*ier = 2;
	//xerfft_("SINT1I", &c__3, (ftnlen)6);
	goto L300;
    }

    pi = atan(1.0) * 4.0;
    if (*n <= 1) {
	return 0;
    }
    ns2 = *n / 2;
    np1 = *n + 1;
    dt = pi / (fft_real_t) np1;
    i__1 = ns2;
    for (k = 1; k <= i__1; ++k) {
	wsave[k] = sin(k * dt) * 2.0;
/* L101: */
    }
    lnsv = np1 + (int) (log((fft_real_t) np1) / log(2.0)) + 4;
    rfft1i_(&np1, &wsave[ns2 + 1], &lnsv, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("SINT1I", &c_n5, (ftnlen)6);
    }

L300:
    return 0;
}